

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint_decoding.h
# Opt level: O2

bool draco::DecodeVarint<unsigned_long>(unsigned_long *out_val,DecoderBuffer *buffer)

{
  bool bVar1;
  
  bVar1 = anon_unknown_2::DecodeVarintUnsigned<unsigned_long>(1,out_val,buffer);
  return bVar1;
}

Assistant:

bool DecodeVarint(IntTypeT *out_val, DecoderBuffer *buffer) {
  if (std::is_unsigned<IntTypeT>::value) {
    if (!DecodeVarintUnsigned<IntTypeT>(1, out_val, buffer)) {
      return false;
    }
  } else {
    // IntTypeT is a signed value. Decode the symbol and convert to signed.
    typename std::make_unsigned<IntTypeT>::type symbol;
    if (!DecodeVarintUnsigned(1, &symbol, buffer)) {
      return false;
    }
    *out_val = ConvertSymbolToSignedInt(symbol);
  }
  return true;
}